

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

Status __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::varStatusToBasisStatusRow
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int row,VarStatus stat)

{
  ostream *poVar1;
  SPxInternalCodeException *this_00;
  int in_EDX;
  Status rstat;
  string *in_stack_ffffffffffffff88;
  allocator local_39;
  string local_38 [36];
  Status local_14;
  int local_10;
  
  switch(in_EDX) {
  case 0:
    local_14 = P_ON_UPPER;
    break;
  case 1:
    local_14 = P_ON_LOWER;
    break;
  case 2:
    local_14 = P_FIXED;
    break;
  case 3:
    local_14 = P_FREE;
    break;
  case 4:
    local_14 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dualRowStatus((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(row,stat),rstat);
    break;
  default:
    local_10 = in_EDX;
    poVar1 = std::operator<<((ostream *)&std::cerr,"ESOLVE27 ERROR: unknown VarStatus (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    poVar1 = std::operator<<(poVar1,")");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"XSOLVE23 This should never happen.",&local_39);
    SPxInternalCodeException::SPxInternalCodeException(this_00,in_stack_ffffffffffffff88);
    __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,
                SPxInternalCodeException::~SPxInternalCodeException);
  }
  return local_14;
}

Assistant:

typename SPxBasisBase<R>::Desc::Status
   SPxSolverBase<R>::varStatusToBasisStatusRow(int row,
         typename SPxSolverBase<R>::VarStatus stat) const
   {
      typename SPxBasisBase<R>::Desc::Status rstat;

      switch(stat)
      {
      case FIXED :
         rstat = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case ON_LOWER :
         rstat = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case ON_UPPER :
         rstat = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case ZERO :
         rstat = SPxBasisBase<R>::Desc::P_FREE;
         break;

      case BASIC :
         rstat = this->dualRowStatus(row);
         break;

      default:
         SPX_MSG_ERROR(std::cerr << "ESOLVE27 ERROR: unknown VarStatus (" << int(stat) << ")"
                       << std::endl;)
         throw SPxInternalCodeException("XSOLVE23 This should never happen.");
      }

      return rstat;
   }